

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmValue __thiscall
cmGeneratorTarget::GetFeature(cmGeneratorTarget *this,string *feature,string *config)

{
  cmValue cVar1;
  string featureConfig;
  char local_69;
  string local_68;
  string local_48;
  
  if (config->_M_string_length != 0) {
    local_69 = '_';
    cmsys::SystemTools::UpperCase(&local_48,config);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string>
              (&local_68,feature,&local_69,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    cVar1 = GetProperty(this,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (cVar1.Value != (string *)0x0) {
      return (cmValue)cVar1.Value;
    }
  }
  cVar1 = GetProperty(this,feature);
  if (cVar1.Value == (string *)0x0) {
    cVar1 = cmLocalGenerator::GetFeature(this->LocalGenerator,feature,config);
  }
  return (cmValue)cVar1.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFeature(const std::string& feature,
                                      const std::string& config) const
{
  if (!config.empty()) {
    std::string featureConfig =
      cmStrCat(feature, '_', cmSystemTools::UpperCase(config));
    if (cmValue value = this->GetProperty(featureConfig)) {
      return value;
    }
  }
  if (cmValue value = this->GetProperty(feature)) {
    return value;
  }
  return this->LocalGenerator->GetFeature(feature, config);
}